

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall IR::Opnd::DumpOpndKindMemRef(Opnd *this,bool AsmDumpMode,Func *func)

{
  AddrOpndKind addressKind;
  MemRefOpnd *this_00;
  void *address;
  char16 local_138 [4];
  char16 buffer [128];
  size_t BUFFER_LEN;
  MemRefOpnd *memRefOpnd;
  Func *func_local;
  bool AsmDumpMode_local;
  Opnd *this_local;
  
  this_00 = AsMemRefOpnd(this);
  Output::Print(L"[");
  address = (void *)MemRefOpnd::GetMemLoc(this_00);
  addressKind = MemRefOpnd::GetAddrKind(this_00);
  GetAddrDescription(local_138,0x80,address,addressKind,AsmDumpMode,true,func,false);
  Output::Print(L"%s",local_138);
  Output::Print(L"]");
  return;
}

Assistant:

void
Opnd::DumpOpndKindMemRef(bool AsmDumpMode, Func *func)
{
    MemRefOpnd *memRefOpnd = this->AsMemRefOpnd();
    Output::Print(_u("["));
    const size_t BUFFER_LEN = 128;
    char16 buffer[BUFFER_LEN];
    // TODO: michhol, make this intptr_t
    GetAddrDescription(buffer, BUFFER_LEN, (void*)memRefOpnd->GetMemLoc(), memRefOpnd->GetAddrKind(), AsmDumpMode, true, func);
    Output::Print(_u("%s"), buffer);
    Output::Print(_u("]"));
}